

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O1

void __thiscall Refal2::CQualifierBuilder::Reset(CQualifierBuilder *this)

{
  this->negative = false;
  this->terms = S_None;
  CSetBuilder<char>::Reset(&this->charsBuilder);
  CSetBuilder<int>::Reset(&this->labelsBuilder);
  CSetBuilder<unsigned_int>::Reset(&this->numbersBuilder);
  (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[1] = 0;
  (this->ansichars).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->ansichars).super__Base_bitset<2UL>._M_w[1] = 0;
  return;
}

Assistant:

void CQualifierBuilder::Reset()
{
	negative = false;
	
	terms = S_None;
	
	charsBuilder.Reset();
	labelsBuilder.Reset();
	numbersBuilder.Reset();
	
	ansichars.reset();
	ansicharsFixed.reset();
}